

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getpart.c
# Opt level: O3

int getpart(char **outbuf,size_t *outlen,char *main,char *sub,FILE *stream)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  byte *__s;
  size_t sVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  size_t uznum;
  byte *pbVar10;
  bool bVar11;
  size_t outalloc;
  char ptag [80];
  char csub [80];
  char cmain [80];
  char patt [80];
  char couter [80];
  int local_204;
  int local_200;
  byte *local_1f8;
  size_t local_1e0;
  char *local_1d8;
  undefined8 local_1d0;
  byte local_1c8 [80];
  char local_178 [80];
  char local_128 [80];
  char local_d8 [80];
  char local_88 [88];
  
  local_1e0 = 0x100;
  *outlen = 0;
  pcVar5 = (char *)(*Curl_cmalloc)(0x100);
  *outbuf = pcVar5;
  if (pcVar5 == (char *)0x0) {
    return -1;
  }
  *pcVar5 = '\0';
  local_d8[0] = '\0';
  local_1c8[0] = 0;
  local_178[0] = '\0';
  local_128[0] = '\0';
  local_88[0] = '\0';
  bVar1 = true;
  __s = (byte *)0x0;
  uznum = 0;
  local_200 = 0;
  local_204 = 0;
  local_1d8 = sub;
  local_1d0 = main;
LAB_00104f54:
  do {
    if (__s == (byte *)0x0) {
      uznum = 0x80;
      __s = (byte *)(*Curl_cmalloc)(0x80);
      if (__s == (byte *)0x0) {
        __s = (byte *)0x0;
LAB_001053a4:
        (*Curl_cfree)(__s);
        iVar3 = -1;
        goto LAB_001053b3;
      }
    }
    iVar3 = curlx_uztosi(uznum);
    pcVar5 = fgets((char *)__s,iVar3,(FILE *)stream);
    if (pcVar5 == (char *)0x0) {
LAB_0010540e:
      (*Curl_cfree)(__s);
      return 0;
    }
    uVar8 = 0;
    do {
      sVar6 = strlen((char *)(__s + uVar8));
      uVar8 = sVar6 + uVar8;
      if (__s[uVar8 - 1] == 10) goto LAB_00105009;
      pbVar10 = __s;
      if (uznum - 1 <= uVar8) {
        uznum = uznum * 2;
        pbVar10 = (byte *)(*Curl_crealloc)(__s,uznum);
        if (pbVar10 == (byte *)0x0) goto LAB_001053a4;
      }
      __s = pbVar10;
      iVar3 = curlx_uztosi(uznum - uVar8);
      pcVar5 = fgets((char *)(__s + uVar8),iVar3,(FILE *)stream);
    } while (pcVar5 != (char *)0x0);
    if (uVar8 == 0) goto LAB_0010540e;
LAB_00105009:
    bVar2 = *__s;
    if (bVar2 == 0) goto LAB_0010503d;
    lVar7 = 2;
    lVar9 = 0;
LAB_00105018:
    iVar3 = Curl_isspace((uint)bVar2);
    if (iVar3 != 0) break;
    if (__s[lVar7 + -2] != 0x3c) goto LAB_0010503d;
    bVar2 = __s[lVar7 + -1];
    if (bVar2 != 0x2f) {
      pbVar10 = __s + -lVar9;
      if (bVar1) goto LAB_001050ac;
      goto LAB_00105047;
    }
    bVar2 = __s[lVar7];
    for (pbVar10 = __s + -lVar9 + 2;
        ((bVar2 != 0 && (iVar3 = Curl_isspace((uint)bVar2), iVar3 == 0)) && (*pbVar10 != 0x3e));
        pbVar10 = pbVar10 + 1) {
      bVar2 = pbVar10[1];
    }
    if (0x4f < (long)(pbVar10 + (lVar9 - (long)__s) + -2)) {
      iVar3 = -2;
      goto LAB_00105397;
    }
    memcpy(local_1c8,__s + lVar7,(size_t)(pbVar10 + (lVar9 - (long)__s) + -2));
    pbVar10[(long)(local_1c8 + ((lVar9 + -2) - (long)__s))] = 0;
    if (local_204 == 1) {
      iVar3 = strcmp(local_88,(char *)local_1c8);
      local_204 = 1;
      if (iVar3 != 0) goto LAB_0010503d;
      local_88[0] = '\0';
      local_204 = 0;
      if (!bVar1) goto LAB_0010540e;
    }
    else {
      if (local_204 != 2) {
        if (local_204 == 3) {
          iVar3 = strcmp(local_178,(char *)local_1c8);
          local_204 = 3;
          if (iVar3 == 0) {
            local_178[0] = '\0';
            local_204 = 2;
            goto LAB_0010528d;
          }
        }
        goto LAB_0010503d;
      }
      iVar3 = strcmp(local_128,(char *)local_1c8);
      local_204 = 2;
      if (iVar3 != 0) goto LAB_0010503d;
      local_128[0] = '\0';
      local_204 = 1;
LAB_0010528d:
      if (!bVar1) {
        if ((local_200 != 0) && (iVar3 = decodedata(outbuf,outlen), iVar3 != 0)) {
          return -1;
        }
        goto LAB_0010540e;
      }
    }
  } while( true );
  bVar2 = __s[lVar7 + -1];
  lVar9 = lVar9 + -1;
  lVar7 = lVar7 + 1;
  if (bVar2 == 0) goto LAB_0010503d;
  goto LAB_00105018;
LAB_001050ac:
  while (((local_1f8 = pbVar10 + 1, bVar2 != 0 && (iVar3 = Curl_isspace((uint)bVar2), iVar3 == 0))
         && (*local_1f8 != 0x3e))) {
    bVar2 = pbVar10[2];
    pbVar10 = local_1f8;
  }
  iVar3 = -2;
  if ((long)(local_1f8 + (lVar9 - (long)__s) + -1) < 0x50) {
    memcpy(local_1c8,__s + lVar7 + -1,(size_t)(local_1f8 + (lVar9 - (long)__s) + -1));
    local_1f8[(long)(local_1c8 + lVar9 + (-1 - (long)__s))] = 0;
    if ((local_1c8[0] != 0x21) && (local_1c8[0] != 0x3f)) {
      bVar2 = *local_1f8;
      while ((bVar2 != 0 && (iVar4 = Curl_isspace((uint)bVar2), iVar4 != 0))) {
        bVar2 = local_1f8[1];
        local_1f8 = local_1f8 + 1;
      }
      for (sVar6 = 0; (local_1f8[sVar6] != 0 && (local_1f8[sVar6] != 0x3e)); sVar6 = sVar6 + 1) {
      }
      if (0x4f < (long)sVar6) goto LAB_00105397;
      memcpy(local_d8,local_1f8,sVar6);
      local_d8[sVar6] = '\0';
      if (local_204 == 0) {
        local_204 = 1;
        pcVar5 = local_88;
      }
      else {
        if (local_204 == 2) {
          strcpy(local_178,(char *)local_1c8);
          iVar3 = strcmp(local_128,local_1d0);
          local_204 = 3;
          bVar1 = true;
          if ((iVar3 == 0) && (iVar3 = strcmp(local_178,local_1d8), iVar3 == 0)) {
            pcVar5 = strstr(local_d8,"base64=");
            if (pcVar5 != (char *)0x0) {
              local_200 = 1;
            }
            local_204 = 3;
            bVar1 = false;
          }
          goto LAB_00104f54;
        }
        bVar11 = local_204 != 1;
        local_204 = 3;
        if (bVar11) {
LAB_0010503d:
          if (bVar1) goto LAB_00104f54;
LAB_00105047:
          iVar3 = appenddata(outbuf,outlen,&local_1e0,(char *)__s,local_200);
          if (iVar3 == 0) goto LAB_00104f54;
          iVar3 = -1;
          goto LAB_00105397;
        }
        local_204 = 2;
        pcVar5 = local_128;
      }
      strcpy(pcVar5,(char *)local_1c8);
    }
    bVar1 = true;
    goto LAB_00104f54;
  }
LAB_00105397:
  (*Curl_cfree)(__s);
LAB_001053b3:
  (*Curl_cfree)(*outbuf);
  *outbuf = (char *)0x0;
  *outlen = 0;
  return iVar3;
}

Assistant:

int getpart(char **outbuf, size_t *outlen,
            const char *main, const char *sub, FILE *stream)
{
# define MAX_TAG_LEN 79
  char couter[MAX_TAG_LEN + 1]; /* current outermost section */
  char cmain[MAX_TAG_LEN + 1];  /* current main section */
  char csub[MAX_TAG_LEN + 1];   /* current sub section */
  char ptag[MAX_TAG_LEN + 1];   /* potential tag */
  char patt[MAX_TAG_LEN + 1];   /* potential attributes */
  char *buffer = NULL;
  char *ptr;
  char *end;
  union {
    ssize_t sig;
     size_t uns;
  } len;
  size_t bufsize = 0;
  size_t outalloc = 256;
  int in_wanted_part = 0;
  int base64 = 0;
  int error;

  enum {
    STATE_OUTSIDE = 0,
    STATE_OUTER   = 1,
    STATE_INMAIN  = 2,
    STATE_INSUB   = 3,
    STATE_ILLEGAL = 4
  } state = STATE_OUTSIDE;

  *outlen = 0;
  *outbuf = malloc(outalloc);
  if(!*outbuf)
    return GPE_OUT_OF_MEMORY;
  *(*outbuf) = '\0';

  couter[0] = cmain[0] = csub[0] = ptag[0] = patt[0] = '\0';

  while((error = readline(&buffer, &bufsize, stream)) == GPE_OK) {

    ptr = buffer;
    EAT_SPACE(ptr);

    if('<' != *ptr) {
      if(in_wanted_part) {
        show(("=> %s", buffer));
        error = appenddata(outbuf, outlen, &outalloc, buffer, base64);
        if(error)
          break;
      }
      continue;
    }

    ptr++;

    if('/' == *ptr) {
      /*
      ** closing section tag
      */

      ptr++;
      end = ptr;
      EAT_WORD(end);
      len.sig = end - ptr;
      if(len.sig > MAX_TAG_LEN) {
        error = GPE_NO_BUFFER_SPACE;
        break;
      }
      memcpy(ptag, ptr, len.uns);
      ptag[len.uns] = '\0';

      if((STATE_INSUB == state) && !strcmp(csub, ptag)) {
        /* end of current sub section */
        state = STATE_INMAIN;
        csub[0] = '\0';
        if(in_wanted_part) {
          /* end of wanted part */
          in_wanted_part = 0;

          /* Do we need to base64 decode the data? */
          if(base64) {
            error = decodedata(outbuf, outlen);
            if(error)
              return error;
          }
          break;
        }
      }
      else if((STATE_INMAIN == state) && !strcmp(cmain, ptag)) {
        /* end of current main section */
        state = STATE_OUTER;
        cmain[0] = '\0';
        if(in_wanted_part) {
          /* end of wanted part */
          in_wanted_part = 0;

          /* Do we need to base64 decode the data? */
          if(base64) {
            error = decodedata(outbuf, outlen);
            if(error)
              return error;
          }
          break;
        }
      }
      else if((STATE_OUTER == state) && !strcmp(couter, ptag)) {
        /* end of outermost file section */
        state = STATE_OUTSIDE;
        couter[0] = '\0';
        if(in_wanted_part) {
          /* end of wanted part */
          in_wanted_part = 0;
          break;
        }
      }

    }
    else if(!in_wanted_part) {
      /*
      ** opening section tag
      */

      /* get potential tag */
      end = ptr;
      EAT_WORD(end);
      len.sig = end - ptr;
      if(len.sig > MAX_TAG_LEN) {
        error = GPE_NO_BUFFER_SPACE;
        break;
      }
      memcpy(ptag, ptr, len.uns);
      ptag[len.uns] = '\0';

      /* ignore comments, doctypes and xml declarations */
      if(('!' == ptag[0]) || ('?' == ptag[0])) {
        show(("* ignoring (%s)", buffer));
        continue;
      }

      /* get all potential attributes */
      ptr = end;
      EAT_SPACE(ptr);
      end = ptr;
      while(*end && ('>' != *end))
        end++;
      len.sig = end - ptr;
      if(len.sig > MAX_TAG_LEN) {
        error = GPE_NO_BUFFER_SPACE;
        break;
      }
      memcpy(patt, ptr, len.uns);
      patt[len.uns] = '\0';

      if(STATE_OUTSIDE == state) {
        /* outermost element (<testcase>) */
        strcpy(couter, ptag);
        state = STATE_OUTER;
        continue;
      }
      else if(STATE_OUTER == state) {
        /* start of a main section */
        strcpy(cmain, ptag);
        state = STATE_INMAIN;
        continue;
      }
      else if(STATE_INMAIN == state) {
        /* start of a sub section */
        strcpy(csub, ptag);
        state = STATE_INSUB;
        if(!strcmp(cmain, main) && !strcmp(csub, sub)) {
          /* start of wanted part */
          in_wanted_part = 1;
          if(strstr(patt, "base64="))
              /* bit rough test, but "mostly" functional, */
              /* treat wanted part data as base64 encoded */
              base64 = 1;
        }
        continue;
      }

    }

    if(in_wanted_part) {
      show(("=> %s", buffer));
      error = appenddata(outbuf, outlen, &outalloc, buffer, base64);
      if(error)
        break;
    }

  } /* while */

  free(buffer);

  if(error != GPE_OK) {
    if(error == GPE_END_OF_FILE)
      error = GPE_OK;
    else {
      free(*outbuf);
      *outbuf = NULL;
      *outlen = 0;
    }
  }

  return error;
}